

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

void __thiscall HevcUnit::updateBits(HevcUnit *this,int bitOffset,int bitLen,uint value)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte *buffer;
  BitStreamWriter bitWriter;
  BitStreamWriter local_50;
  
  iVar5 = bitOffset + 7;
  if (-1 < bitOffset) {
    iVar5 = bitOffset;
  }
  buffer = (byte *)((long)(iVar5 >> 3) + (long)(this->m_reader).super_BitStream.m_initBuffer);
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  uVar3 = bitOffset % 8;
  iVar5 = bitLen + 7;
  if (-1 < bitLen) {
    iVar5 = bitLen;
  }
  local_50.m_curVal = 0;
  local_50.m_bitWrited = 0;
  BitStream::setBuffer(&local_50.super_BitStream,buffer,buffer + (long)(iVar5 >> 3) + 5);
  local_50.m_curVal = 0;
  local_50.m_bitWrited = 0;
  puVar1 = (this->m_reader).super_BitStream.m_initBuffer;
  uVar4 = bitLen + bitOffset;
  uVar2 = bitLen + 7 + bitOffset;
  if (-1 < (int)uVar4) {
    uVar2 = uVar4;
  }
  iVar5 = uVar4 - (uVar2 & 0xfffffff8);
  if (0 < (int)uVar3) {
    BitStreamWriter::putBits(&local_50,uVar3,(uint)(*buffer >> (8U - (char)uVar3 & 0x1f)));
  }
  BitStreamWriter::putBits(&local_50,bitLen,value);
  if (0 < iVar5) {
    uVar3 = 8 - iVar5;
    BitStreamWriter::putBits
              (&local_50,uVar3,
               ~(-1 << ((byte)uVar3 & 0x1f)) &
               (uint)*(byte *)((long)puVar1 + (long)((int)uVar2 >> 3)));
  }
  BitStreamWriter::flushBits(&local_50);
  return;
}

Assistant:

void HevcUnit::updateBits(const int bitOffset, const int bitLen, const unsigned value) const
{
    uint8_t* ptr = m_reader.getBuffer() + bitOffset / 8;
    BitStreamWriter bitWriter{};
    const int byteOffset = bitOffset % 8;
    bitWriter.setBuffer(ptr, ptr + (bitLen / 8 + 5));

    const uint8_t* ptr_end = m_reader.getBuffer() + (bitOffset + bitLen) / 8;
    const int endBitsPostfix = 8 - ((bitOffset + bitLen) % 8);

    if (byteOffset > 0)
    {
        const int prefix = *ptr >> (8 - byteOffset);
        bitWriter.putBits(byteOffset, prefix);
    }
    bitWriter.putBits(bitLen, value);

    if (endBitsPostfix < 8)
    {
        const int postfix = *ptr_end & (1 << endBitsPostfix) - 1;
        bitWriter.putBits(endBitsPostfix, postfix);
    }
    bitWriter.flushBits();
}